

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void vera::refineSdfLayers
               (BVH *_acc,vector<vera::Image,_std::allocator<vera::Image>_> *_images,float _dist)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  ulong uVar5;
  float fVar6;
  result_type rVar7;
  result_type rVar8;
  result_type rVar9;
  float scalar;
  vec3 vVar10;
  vec<3,_float,_(glm::qualifier)0> vVar11;
  float local_1cc;
  thread *t;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  vector<vera::Image,_std::allocator<vera::Image>_> *local_150;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_148;
  size_t local_140;
  id local_138;
  size_type local_130;
  float local_128;
  float local_124;
  thread local_120;
  thread thrd;
  size_t end;
  size_t start;
  size_t i_1;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  size_t trisLeftOver;
  size_t trisPerThread;
  int nThreads;
  float scale;
  undefined8 local_b4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_ac;
  ulong local_a8;
  size_t i;
  allocator<glm::vec<3,_float,_(glm::qualifier)0>_> local_89;
  undefined1 local_88 [8];
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  samples;
  default_random_engine generator;
  uniform_real_distribution<float> randomFloats;
  float max_dist;
  undefined1 local_48 [8];
  vec3 bdiagonal;
  size_t triangles_total;
  float voxel_size;
  size_t voxel_resolution;
  float _dist_local;
  vector<vera::Image,_std::allocator<vera::Image>_> *_images_local;
  BVH *_acc_local;
  
  sVar3 = std::vector<vera::Image,_std::allocator<vera::Image>_>::size(_images);
  register0x00000000 =
       std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::size(&_acc->elements);
  vVar10 = BoundingBox::getDiagonal(&_acc->super_BoundingBox);
  bdiagonal.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar10.field_2
  ;
  local_48 = vVar10._0_8_;
  fVar6 = glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)local_48);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)((long)&generator._M_x + 4),0.0,1.0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &samples.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::allocator(&local_89);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)local_88,0x40,&local_89);
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::~allocator(&local_89);
  for (local_a8 = 0; local_a8 < 0x40; local_a8 = local_a8 + 1) {
    rVar7 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)((long)&generator._M_x + 4),
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &samples.
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    rVar8 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)((long)&generator._M_x + 4),
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &samples.
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    rVar9 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)((long)&generator._M_x + 4),
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &samples.
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_b4,(double)rVar7 + (double)rVar7 + -1.0,
               (double)rVar8 + (double)rVar8 + -1.0,(double)rVar9 + (double)rVar9 + -1.0);
    pvVar4 = std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           *)local_88,local_a8);
    pvVar4->field_2 = local_ac;
    pvVar4->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_b4;
    pvVar4->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_b4._4_4_
    ;
    pvVar4 = std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           *)local_88,local_a8);
    vVar11 = glm::normalize<3,float,(glm::qualifier)0>(pvVar4);
    pvVar4 = std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           *)local_88,local_a8);
    pvVar4->field_2 = vVar11.field_2;
    pvVar4->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)vVar11._0_8_;
    pvVar4->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
         (int)((ulong)vVar11._0_8_ >> 0x20);
    local_1cc = (float)local_a8;
    scalar = lerp(0.1,1.0,local_1cc * 0.015625 * local_1cc * 0.015625);
    pvVar4 = std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           *)local_88,local_a8);
    glm::vec<3,float,(glm::qualifier)0>::operator*=((vec<3,float,(glm::qualifier)0> *)pvVar4,scalar)
    ;
  }
  iVar2 = std::thread::hardware_concurrency();
  uVar5 = stack0xffffffffffffffc8 / (ulong)(long)iVar2;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(stack0xffffffffffffffc8 % (ulong)(long)iVar2);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&i_1);
  for (start = 0; start < (ulong)(long)iVar2; start = start + 1) {
    local_140 = start * uVar5;
    thrd._M_id._M_thread = (id)(local_140 + uVar5);
    if (start == (long)(iVar2 + -1)) {
      thrd._M_id._M_thread =
           (id)((long)&((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage)->_M_id)._M_thread +
               local_140 + uVar5);
    }
    local_148 = (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 *)local_88;
    local_138 = thrd._M_id._M_thread;
    __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)_acc;
    local_150 = _images;
    local_130 = sVar3;
    local_128 = fVar6 * 0.5;
    local_124 = _dist;
    std::thread::
    thread<vera::refineSdfLayers(vera::BVH_const*,std::vector<vera::Image,std::allocator<vera::Image>>&,float)::__0,,void>
              (&local_120,(type *)&__range1);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)&i_1,&local_120);
    std::thread::~thread(&local_120);
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)&i_1);
  t = (thread *)
      std::vector<std::thread,_std::allocator<std::thread>_>::end
                ((vector<std::thread,_std::allocator<std::thread>_> *)&i_1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&t), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&i_1);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)local_88);
  return;
}

Assistant:

void refineSdfLayers(const BVH* _acc, std::vector<Image>& _images, float _dist) {

    size_t voxel_resolution = _images.size();
    float voxel_size        = 1.0/float(voxel_resolution);

    size_t triangles_total  = _acc->elements.size(); 
    glm::vec3 bdiagonal     = _acc->getDiagonal();
    float max_dist          = glm::length(bdiagonal) * 0.5f;

    std::uniform_real_distribution<float> randomFloats(0.0, 1.0); // random floats between [0.0, 1.0]
    std::default_random_engine generator;

    // Random vectors
    std::vector<glm::vec3> samples(64);
    for (size_t i = 0; i < 64; ++i) {
        samples[i] = glm::vec3( randomFloats(generator) * 2.0 - 1.0, 
                                randomFloats(generator) * 2.0 - 1.0, 
                                randomFloats(generator) * 2.0 - 1.0);
        samples[i] = glm::normalize(samples[i]);
        float scale = (float)i / 64.0;
        scale   = vera::lerp(0.1f, 1.0f, scale * scale);
        samples[i] *= scale;
    }

    const int nThreads      = std::thread::hardware_concurrency();
    size_t trisPerThread    = triangles_total / nThreads;
    size_t trisLeftOver     = triangles_total % nThreads;

    std::vector<std::thread> threads;
    for (size_t i = 0; i < nThreads; ++i) {
        size_t start = i * trisPerThread;
        size_t end = start + trisPerThread;
        if (i == nThreads - 1)
            end = start + trisPerThread + trisLeftOver;

        std::thread thrd(
            [_acc, &_images, &samples, start, end, voxel_resolution, max_dist, _dist]() {
                for (size_t t = start; t < end; t++) {
                    // glm::vec3 p = (glm::vec3(x, y, _z_layer) + 0.5f) * voxel_size;
                    // p = _acc->min + p * bdiagonal;

                    glm::vec3 p = _acc->elements[t].getCentroid();
                    p = p + (_acc->elements[t].getNormal() * max_dist * _dist) + samples[t%64] * max_dist * _dist * 0.5f;

                    if (_acc->contains(p)) {
                        glm::vec4 c = _acc->getClosestRGBSignedDistance(p);
                        c.a = glm::clamp(c.a/max_dist, -1.0f, 1.0f) * 0.5 + 0.5;

                        glm::ivec3 v = remap(p, _acc->min, _acc->max, glm::vec3(0.0f), glm::vec3(voxel_resolution), true);
                        size_t z = v.z % voxel_resolution;
                        size_t index = _images[z].getIndex(v.x % voxel_resolution, v.y % voxel_resolution);
                        _images[z].setColor(index, c);
                    }
                }
            }
        );
        threads.push_back(std::move(thrd));
    }

    for (std::thread& t : threads)
        t.join();
}